

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> * __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::operator=
          (ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this,
          ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *other)

{
  OutputDirective *pOVar1;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar2;
  OutputDirective *pOVar3;
  ArrayDisposer *pAVar4;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (OutputDirective *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (OutputDirective *)0x0;
    this->pos = (RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *)0x0;
    this->endPtr = (OutputDirective *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x30,((long)pRVar2 - (long)pOVar1 >> 4) * -0x5555555555555555,
               ((long)pOVar3 - (long)pOVar1 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<capnp::compiler::CompilerMain::OutputDirective>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (OutputDirective *)0x0;
  other->pos = (RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *)0x0;
  other->endPtr = (OutputDirective *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }